

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O1

void __thiscall
TxInReference_Constractor_Test::~TxInReference_Constractor_Test
          (TxInReference_Constractor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TxInReference, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    TxInReference txin_ref(txin);

    EXPECT_EQ(txin_ref.GetVout(), exp_index);
    EXPECT_EQ(txin_ref.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin_ref.GetTxid().GetHex().c_str(),
                 exp_txid.GetHex().c_str());
  }
}